

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O0

void __thiscall helics::CustomMessageOperator::~CustomMessageOperator(CustomMessageOperator *this)

{
  FilterOperator *in_RDI;
  
  in_RDI->_vptr_FilterOperator = (_func_int **)&PTR__CustomMessageOperator_00a69610;
  std::
  function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  ::~function((function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
               *)0x423c2a);
  FilterOperator::~FilterOperator(in_RDI);
  return;
}

Assistant:

class HELICS_CXX_EXPORT CustomMessageOperator: public FilterOperator {
  public:
    /** default constructor*/
    CustomMessageOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit CustomMessageOperator(
        std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction);
    /** set the function to modify the data of the message*/
    void setMessageFunction(
        std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction);

  private:
    std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)>
        messageFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}